

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerBase::SetPropertyWithAttributes
          (PathTypeHandlerBase *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyAttributes attributes,PropertyValueInfo *info,PropertyOperationFlags flags,
          SideEffects possibleSideEffects)

{
  bool bVar1;
  ObjectSlotAttributes attr;
  uint16 uVar2;
  PropertyIndex index_00;
  ScriptContext *pSVar3;
  DynamicTypeHandler *pDVar4;
  undefined8 in_stack_ffffffffffffff68;
  undefined4 uVar5;
  PropertyIndex index;
  PropertyValueInfo *info_local;
  PropertyAttributes attributes_local;
  Var value_local;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerBase *this_local;
  
  uVar5 = (undefined4)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  bVar1 = ObjectSlotAttributesContains(attributes);
  if ((!bVar1) ||
     (bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,ShareTypesWithAttributesPhase), bVar1)) {
    pSVar3 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
    pSVar3->convertPathToDictionaryAttributesCount =
         pSVar3->convertPathToDictionaryAttributesCount + 1;
    uVar2 = GetPathLength(this);
    pDVar4 = TryConvertToSimpleDictionaryType(this,instance,uVar2 + 1,false);
    this_local._4_4_ =
         (*pDVar4->_vptr_DynamicTypeHandler[0x3a])
                   (pDVar4,instance,(ulong)(uint)propertyId,value,(ulong)attributes,info,
                    CONCAT44(uVar5,flags),(uint)possibleSideEffects);
  }
  else {
    index_00 = GetPropertyIndex(this,propertyId);
    attr = PropertyAttributesToObjectSlotAttributes(attributes);
    this_local._4_4_ =
         SetPropertyInternal<true>
                   (this,instance,propertyId,index_00,value,attr,info,flags,possibleSideEffects,
                    false);
  }
  return this_local._4_4_;
}

Assistant:

BOOL PathTypeHandlerBase::SetPropertyWithAttributes(DynamicObject* instance, PropertyId propertyId, Var value, PropertyAttributes attributes, PropertyValueInfo* info, PropertyOperationFlags flags, SideEffects possibleSideEffects)
    {
        if (!ObjectSlotAttributesContains(attributes) || PHASE_OFF1(ShareTypesWithAttributesPhase))
        {
#ifdef PROFILE_TYPES
            instance->GetScriptContext()->convertPathToDictionaryAttributesCount++;
#endif

            return TryConvertToSimpleDictionaryType(instance, GetPathLength() + 1)->SetPropertyWithAttributes(instance, propertyId, value, attributes, info, flags, possibleSideEffects);
        }

        PropertyIndex index = PathTypeHandlerBase::GetPropertyIndex(propertyId);
        return PathTypeHandlerBase::SetPropertyInternal<true>(instance, propertyId, index, value, PropertyAttributesToObjectSlotAttributes(attributes), info, flags, possibleSideEffects);
    }